

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O2

mat3 * dja::mat3::lookat(mat3 *__return_storage_ptr__,vec3 *target,vec3 *origin,vec3 *up)

{
  vec3 vVar1;
  mat3 local_68;
  vec3 local_40;
  vec3 local_30;
  
  local_68.m[0] = operator-(origin,target);
  local_30 = normalize(local_68.m);
  local_68.m[0] = cross(up,&local_30);
  local_40 = normalize(local_68.m);
  local_68.m[0] = cross(&local_30,&local_40);
  local_68.m[2] = normalize(local_68.m);
  vVar1 = local_40;
  local_68.m[0] = local_30;
  local_68.m[1].x = local_40.x;
  local_68.m[1].y = local_40.y;
  local_40.z = vVar1.z;
  local_68.m[1].z = local_40.z;
  local_40 = vVar1;
  transpose(&local_68);
  return __return_storage_ptr__;
}

Assistant:

mat3
mat3::lookat(const vec3 &target, const vec3 &origin, const vec3 &up)
{
    vec3 x = normalize(origin - target);
    vec3 y = normalize(cross(up, x));
    vec3 z = normalize(cross(x, y));

    return transpose(mat3(x, y, z));
}